

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::VariablePortHeaderSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,VariablePortHeaderSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  SyntaxNode *node;
  size_t index_local;
  VariablePortHeaderSyntax *this_local;
  
  switch(index) {
  case 0:
    token.kind = (this->constKeyword).kind;
    token._2_1_ = (this->constKeyword).field_0x2;
    token.numFlags.raw = (this->constKeyword).numFlags.raw;
    token.rawLen = (this->constKeyword).rawLen;
    token.info = (this->constKeyword).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 1:
    token_00.kind = (this->direction).kind;
    token_00._2_1_ = (this->direction).field_0x2;
    token_00.numFlags.raw = (this->direction).numFlags.raw;
    token_00.rawLen = (this->direction).rawLen;
    token_00.info = (this->direction).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 2:
    token_01.kind = (this->varKeyword).kind;
    token_01._2_1_ = (this->varKeyword).field_0x2;
    token_01.numFlags.raw = (this->varKeyword).numFlags.raw;
    token_01.rawLen = (this->varKeyword).rawLen;
    token_01.info = (this->varKeyword).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  case 3:
    node = (SyntaxNode *)not_null<slang::syntax::DataTypeSyntax_*>::get(&this->dataType);
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,node);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax VariablePortHeaderSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return constKeyword;
        case 1: return direction;
        case 2: return varKeyword;
        case 3: return dataType.get();
        default: return nullptr;
    }
}